

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ExternUdpDeclSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExternUdpDeclSyntax,slang::syntax::ExternUdpDeclSyntax_const&>
          (BumpAllocator *this,ExternUdpDeclSyntax *args)

{
  ExternUdpDeclSyntax *this_00;
  
  this_00 = (ExternUdpDeclSyntax *)allocate(this,0xc0,8);
  slang::syntax::ExternUdpDeclSyntax::ExternUdpDeclSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }